

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfRelocator.cpp
# Opt level: O0

bool __thiscall ElfRelocator::relocate(ElfRelocator *this,int64_t *memoryAddress)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  size_t sVar6;
  reference file_00;
  int newCrc;
  ElfRelocatorFile *file;
  iterator __end1;
  iterator __begin1;
  vector<ElfRelocatorFile,_std::allocator<ElfRelocatorFile>_> *__range1;
  int64_t start;
  bool error;
  int oldCrc;
  int64_t *memoryAddress_local;
  ElfRelocator *this_local;
  
  pbVar5 = ByteArray::data(&this->outputData,0);
  sVar6 = ByteArray::size(&this->outputData);
  uVar3 = getCrc32(pbVar5,sVar6);
  ByteArray::clear(&this->outputData);
  this->dataChanged = false;
  start._3_1_ = 0;
  lVar1 = *memoryAddress;
  __end1 = std::vector<ElfRelocatorFile,_std::allocator<ElfRelocatorFile>_>::begin(&this->files);
  file = (ElfRelocatorFile *)
         std::vector<ElfRelocatorFile,_std::allocator<ElfRelocatorFile>_>::end(&this->files);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<ElfRelocatorFile_*,_std::vector<ElfRelocatorFile,_std::allocator<ElfRelocatorFile>_>_>
                                *)&file);
    if (!bVar2) break;
    file_00 = __gnu_cxx::
              __normal_iterator<ElfRelocatorFile_*,_std::vector<ElfRelocatorFile,_std::allocator<ElfRelocatorFile>_>_>
              ::operator*(&__end1);
    bVar2 = relocateFile(this,file_00,memoryAddress);
    if (!bVar2) {
      start._3_1_ = 1;
    }
    __gnu_cxx::
    __normal_iterator<ElfRelocatorFile_*,_std::vector<ElfRelocatorFile,_std::allocator<ElfRelocatorFile>_>_>
    ::operator++(&__end1);
  }
  pbVar5 = ByteArray::data(&this->outputData,0);
  sVar6 = ByteArray::size(&this->outputData);
  uVar4 = getCrc32(pbVar5,sVar6);
  if (uVar3 != uVar4) {
    this->dataChanged = true;
  }
  *memoryAddress = *memoryAddress - lVar1;
  return (bool)((start._3_1_ ^ 0xff) & 1);
}

Assistant:

bool ElfRelocator::relocate(int64_t& memoryAddress)
{
	int oldCrc = getCrc32(outputData.data(),outputData.size());
	outputData.clear();
	dataChanged = false;

	bool error = false;
	int64_t start = memoryAddress;

	for (ElfRelocatorFile& file: files)
	{
		if (!relocateFile(file,memoryAddress))
			error = true;
	}
	
	int newCrc = getCrc32(outputData.data(),outputData.size());
	if (oldCrc != newCrc)
		dataChanged = true;

	memoryAddress -= start;
	return !error;
}